

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O3

void __thiscall Game::GameBoard::GameBoard(GameBoard *this,ull playsize)

{
  allocator_type local_31;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_30;
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_30,playsize * playsize,&local_31);
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)this,&local_30);
  (this->gbda).
  super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = playsize;
  this->win = false;
  this->moved = true;
  this->score = 0;
  this->largestTile = 2;
  this->moveCount = -1;
  if (local_30.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

GameBoard::GameBoard(ull playsize)
    : GameBoard{playsize, tile_data_array_t(playsize * playsize)} {
}